

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

QItemSelection * __thiscall
QItemSelectionModel::selection(QItemSelection *__return_storage_ptr__,QItemSelectionModel *this)

{
  long lVar1;
  Data *pDVar2;
  
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size =
       (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr =
       (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = *(Data **)(lVar1 + 0x80);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = pDVar2;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr =
       *(QItemSelectionRange **)(lVar1 + 0x88);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = *(qsizetype *)(lVar1 + 0x90);
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  QItemSelection::merge
            (__return_storage_ptr__,(QItemSelection *)(lVar1 + 0x98),
             (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
             ((QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> *)(lVar1 + 0xb8))->
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>);
  QList<QItemSelectionRange>::removeIf<(anonymous_namespace)::QtFunctionObjects::IsNotValid>
            (&__return_storage_ptr__->super_QList<QItemSelectionRange>);
  return __return_storage_ptr__;
}

Assistant:

const QItemSelection QItemSelectionModel::selection() const
{
    Q_D(const QItemSelectionModel);
    QItemSelection selected = d->ranges;
    selected.merge(d->currentSelection, d->currentCommand);
    // make sure we have no invalid ranges
    // ###  should probably be handled more generic somewhere else
    selected.removeIf(QtFunctionObjects::IsNotValid());
    return selected;
}